

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void PlanarTo24b_SSE2(__m128i *in0,__m128i *in1,__m128i *in2,__m128i *in3,__m128i *in4,__m128i *in5,
                     uint8_t *rgb)

{
  longlong lVar1;
  longlong *in_RCX;
  longlong *in_RDX;
  longlong *in_RSI;
  longlong *in_RDI;
  longlong *in_R8;
  longlong *in_R9;
  __m128i *in_stack_ffffffffffffffb0;
  __m128i *in_stack_ffffffffffffffb8;
  __m128i *in_stack_ffffffffffffffc0;
  __m128i *in_stack_ffffffffffffffc8;
  __m128i *in_stack_ffffffffffffffd0;
  __m128i *in_stack_ffffffffffffffd8;
  
  VP8PlanarTo24b_SSE2(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  lVar1 = in_RDI[1];
  (*in4)[0] = *in_RDI;
  (*in4)[1] = lVar1;
  lVar1 = in_RSI[1];
  in4[1][0] = *in_RSI;
  in4[1][1] = lVar1;
  lVar1 = in_RDX[1];
  in4[2][0] = *in_RDX;
  in4[2][1] = lVar1;
  lVar1 = in_RCX[1];
  in4[3][0] = *in_RCX;
  in4[3][1] = lVar1;
  lVar1 = in_R8[1];
  in4[4][0] = *in_R8;
  in4[4][1] = lVar1;
  lVar1 = in_R9[1];
  in4[5][0] = *in_R9;
  in4[5][1] = lVar1;
  return;
}

Assistant:

static WEBP_INLINE void PlanarTo24b_SSE2(__m128i* const in0, __m128i* const in1,
                                         __m128i* const in2, __m128i* const in3,
                                         __m128i* const in4, __m128i* const in5,
                                         uint8_t* const rgb) {
  // The input is 6 registers of sixteen 8b but for the sake of explanation,
  // let's take 6 registers of four 8b values.
  // To pack, we will keep taking one every two 8b integer and move it
  // around as follows:
  // Input:
  //   r0r1r2r3 | r4r5r6r7 | g0g1g2g3 | g4g5g6g7 | b0b1b2b3 | b4b5b6b7
  // Split the 6 registers in two sets of 3 registers: the first set as the even
  // 8b bytes, the second the odd ones:
  //   r0r2r4r6 | g0g2g4g6 | b0b2b4b6 | r1r3r5r7 | g1g3g5g7 | b1b3b5b7
  // Repeat the same permutations twice more:
  //   r0r4g0g4 | b0b4r1r5 | g1g5b1b5 | r2r6g2g6 | b2b6r3r7 | g3g7b3b7
  //   r0g0b0r1 | g1b1r2g2 | b2r3g3b3 | r4g4b4r5 | g5b5r6g6 | b6r7g7b7
  VP8PlanarTo24b_SSE2(in0, in1, in2, in3, in4, in5);

  _mm_storeu_si128((__m128i*)(rgb +  0), *in0);
  _mm_storeu_si128((__m128i*)(rgb + 16), *in1);
  _mm_storeu_si128((__m128i*)(rgb + 32), *in2);
  _mm_storeu_si128((__m128i*)(rgb + 48), *in3);
  _mm_storeu_si128((__m128i*)(rgb + 64), *in4);
  _mm_storeu_si128((__m128i*)(rgb + 80), *in5);
}